

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PField * __thiscall PStruct::AddField(PStruct *this,FName *name,PType *type,DWORD flags)

{
  uint uVar1;
  PStruct *this_00;
  PSymbol *pPVar2;
  FName local_3c;
  PStruct *local_38;
  PField *field;
  PType *pPStack_28;
  DWORD flags_local;
  PType *type_local;
  FName *name_local;
  PStruct *this_local;
  
  field._4_4_ = flags;
  pPStack_28 = type;
  type_local = (PType *)name;
  name_local = (FName *)this;
  this_00 = (PStruct *)DObject::operator_new((DObject *)0x40,(size_t)name);
  FName::FName(&local_3c,name);
  PField::PField((PField *)this_00,&local_3c,pPStack_28,field._4_4_,0,0);
  *(ulong *)&(this_00->super_PNamedType).super_PCompoundType.super_PType.Align =
       (ulong)(*(int *)&(this->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                        super_DObject.field_0x24 + (pPStack_28->Align - 1) &
              (pPStack_28->Align - 1 ^ 0xffffffff));
  *(int *)&(this->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
           field_0x24 =
       (int)*(undefined8 *)&(this_00->super_PNamedType).super_PCompoundType.super_PType.Align +
       *(int *)&(pPStack_28->super_PTypeBase).super_DObject.field_0x24;
  local_38 = this_00;
  uVar1 = MAX<unsigned_int>((this->super_PNamedType).super_PCompoundType.super_PType.Align,
                            pPStack_28->Align);
  (this->super_PNamedType).super_PCompoundType.super_PType.Align = uVar1;
  pPVar2 = PSymbolTable::AddSymbol
                     (&(this->super_PNamedType).super_PCompoundType.super_PType.Symbols,
                      (PSymbol *)local_38);
  if (pPVar2 == (PSymbol *)0x0) {
    if (local_38 != (PStruct *)0x0) {
      (*(local_38->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
        _vptr_DObject[2])();
    }
    this_local = (PStruct *)0x0;
  }
  else {
    TArray<PField_*,_PField_*>::Push(&this->Fields,(PField **)&local_38);
    this_local = local_38;
  }
  return (PField *)this_local;
}

Assistant:

PField *PStruct::AddField(FName name, PType *type, DWORD flags)
{
	PField *field = new PField(name, type, flags);

	// The new field is added to the end of this struct, alignment permitting.
	field->Offset = (Size + (type->Align - 1)) & ~(type->Align - 1);

	// Enlarge this struct to enclose the new field.
	Size = unsigned(field->Offset + type->Size);

	// This struct's alignment is the same as the largest alignment of any of
	// its fields.
	Align = MAX(Align, type->Align);

	if (Symbols.AddSymbol(field) == NULL)
	{ // name is already in use
		delete field;
		return NULL;
	}
	Fields.Push(field);

	return field;
}